

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::cMoveUp(Forth *this)

{
  Char value;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint local_20;
  uint offset;
  Cell i;
  CAddr src;
  CAddr dst;
  uint length;
  Forth *this_local;
  
  requireDStackDepth(this,3,"CMOVE>");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    iVar4 = (uVar1 - local_20) + -1;
    value = dataSpaceAt(this,uVar3 + iVar4);
    dataSpaceSet(this,uVar2 + iVar4,value);
  }
  return;
}

Assistant:

void cMoveUp() {
			REQUIRE_DSTACK_DEPTH(3, "CMOVE>");
			auto length = dStack.getTop(); pop();
			auto dst = CADDR(dStack.getTop()); pop();
			auto src = CADDR(dStack.getTop()); pop();
			for (Cell i = 0; i < length; ++i) {
				auto offset = length - i - 1;
				dataSpaceSet(dst + offset, dataSpaceAt(src + offset));
			}
		}